

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

int nn_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (in_len == 0) {
    uVar5 = 0;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    uVar7 = 0;
    uVar5 = 0;
    do {
      bVar1 = in[uVar2];
      uVar3 = uVar3 << 8 | (uint)bVar1;
      iVar6 = uVar7 + 2;
      uVar7 = uVar7 + 8;
      do {
        uVar4 = uVar5;
        if (out_len <= uVar4) {
          return -0x69;
        }
        uVar7 = uVar7 - 6;
        uVar5 = uVar4 + 1;
        out[uVar4] = (&DAT_00134a60)[uVar3 >> ((byte)iVar6 & 0x1f) & 0x3f];
        iVar6 = iVar6 + -6;
      } while (5 < uVar7);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < in_len);
    if (uVar7 != 0) {
      uVar2 = (ulong)uVar5;
      if (out_len <= uVar2) {
        return -0x69;
      }
      uVar5 = uVar4 + 2;
      out[uVar2] = (&DAT_00134a60)[(uint)bVar1 << (-(char)iVar6 & 0x1fU) & 0x3f];
    }
    for (; (uVar5 & 3) != 0; uVar5 = uVar5 + 1) {
      if (out_len <= uVar5) {
        return -0x69;
      }
      out[uVar5] = '=';
    }
  }
  uVar7 = 0xffffff97;
  if (uVar5 < out_len) {
    out[uVar5] = '\0';
    uVar7 = uVar5;
  }
  return uVar7;
}

Assistant:

int nn_base64_encode (const uint8_t *in, size_t in_len,
    char *out, size_t out_len)
{
    unsigned ii;
    unsigned io;
    unsigned rem;
    uint32_t v;
    uint8_t ch;

    const uint8_t ENCODEMAP [64] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz"
        "0123456789+/";

    for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
        ch = in [ii];
        v = (v << 8) | ch;
        rem += 8;
        while (rem >= 6) {
            rem -= 6;
            if (io >= out_len)
                return -ENOBUFS;
            out [io++] = ENCODEMAP [(v >> rem) & 63];
        }
    }

    if (rem) {
        v <<= (6 - rem);
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = ENCODEMAP [v & 63];
    }

    /*  Pad to a multiple of 3. */
    while (io & 3) {
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = '=';
    }

    if (io >= out_len)
        return -ENOBUFS;
    
    out [io] = '\0';

    return io;
}